

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizard::setField(QWizard *this,QString *name,QVariant *value)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined8 *puVar4;
  char *pcVar5;
  long lVar6;
  long in_FS_OFFSET;
  int local_48 [6];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  local_48[0] = -1;
  iVar3 = QMap<QString,_int>::value((QMap<QString,_int> *)(lVar1 + 0x300),name,local_48);
  if (iVar3 == -1) {
    local_48[0] = 2;
    local_48[5] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    local_48[4] = 0;
    local_30 = "default";
    puVar4 = (undefined8 *)QString::utf16();
    pcVar5 = "QWizard::setField: No such field \'%ls\'";
  }
  else {
    lVar1 = *(long *)(lVar1 + 0x2f0);
    lVar6 = (long)iVar3 * 0x80;
    pcVar5 = *(char **)(lVar1 + 0x38 + lVar6);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)&QByteArray::_empty;
    }
    bVar2 = QObject::setProperty(*(QObject **)(lVar1 + 0x28 + lVar6),pcVar5,value);
    if (bVar2) goto LAB_004c4274;
    local_48[0] = 2;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    local_48[4] = 0;
    local_48[5] = 0;
    local_30 = "default";
    puVar4 = *(undefined8 **)(lVar1 + lVar6 + 0x38);
    if (puVar4 == (undefined8 *)0x0) {
      puVar4 = &QByteArray::_empty;
    }
    pcVar5 = "QWizard::setField: Couldn\'t write to property \'%s\'";
  }
  QMessageLogger::warning((char *)local_48,pcVar5,puVar4);
LAB_004c4274:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizard::setField(const QString &name, const QVariant &value)
{
    Q_D(QWizard);

    int index = d->fieldIndexMap.value(name, -1);
    if (Q_UNLIKELY(index == -1)) {
        qWarning("QWizard::setField: No such field '%ls'", qUtf16Printable(name));
        return;
    }

    const QWizardField &field = d->fields.at(index);
    if (Q_UNLIKELY(!field.object->setProperty(field.property, value)))
        qWarning("QWizard::setField: Couldn't write to property '%s'",
                 field.property.constData());
}